

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

string * __thiscall
cmTarget::GetDebugGeneratorExpressions
          (string *__return_storage_ptr__,cmTarget *this,string *value,cmTargetLinkLibraryType llt)

{
  string *__rhs;
  cmake *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  string configString;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugConfigs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string *local_78;
  string *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (llt == GENERAL_LibraryType) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  }
  else {
    this_00 = cmMakefile::GetCMakeInstance(this->Makefile);
    cmake::GetDebugConfigs_abi_cxx11_(&local_68,this_00);
    std::operator+(&local_b8,"$<CONFIG:",
                   local_68.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
    local_78 = value;
    local_70 = __return_storage_ptr__;
    std::operator+(&local_98,&local_b8,">");
    std::__cxx11::string::~string((string *)&local_b8);
    if (0x20 < (ulong)((long)local_68.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_68.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      __rhs_00 = local_68.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      while (__rhs_00 = __rhs_00 + 1,
            __rhs_00 !=
            local_68.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator+(&local_d8,",$<CONFIG:",__rhs_00);
        std::operator+(&local_b8,&local_d8,">");
        std::__cxx11::string::append((string *)&local_98);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_d8);
      }
      std::operator+(&local_d8,"$<OR:",&local_98);
      std::operator+(&local_b8,&local_d8,">");
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    __return_storage_ptr__ = local_70;
    __rhs = local_78;
    if (llt == OPTIMIZED_LibraryType) {
      std::operator+(&local_d8,"$<NOT:",&local_98);
      std::operator+(&local_b8,&local_d8,">");
      std::__cxx11::string::operator=((string *)&local_98,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    std::operator+(&local_50,"$<",&local_98);
    std::operator+(&local_d8,&local_50,":");
    std::operator+(&local_b8,&local_d8,__rhs);
    std::operator+(__return_storage_ptr__,&local_b8,">");
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetDebugGeneratorExpressions(
  const std::string& value, cmTargetLinkLibraryType llt) const
{
  if (llt == GENERAL_LibraryType) {
    return value;
  }

  // Get the list of configurations considered to be DEBUG.
  std::vector<std::string> debugConfigs =
    this->Makefile->GetCMakeInstance()->GetDebugConfigs();

  std::string configString = "$<CONFIG:" + debugConfigs[0] + ">";

  if (debugConfigs.size() > 1) {
    for (std::vector<std::string>::const_iterator li =
           debugConfigs.begin() + 1;
         li != debugConfigs.end(); ++li) {
      configString += ",$<CONFIG:" + *li + ">";
    }
    configString = "$<OR:" + configString + ">";
  }

  if (llt == OPTIMIZED_LibraryType) {
    configString = "$<NOT:" + configString + ">";
  }
  return "$<" + configString + ":" + value + ">";
}